

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::AddWarning(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *this,string *key,string *msg,bool replace)

{
  BasicSolver *this_00;
  string sStack_68;
  string local_48;
  
  this_00 = (this->super_EnvKeeper).env_;
  std::__cxx11::string::string((string *)&local_48,(string *)key);
  std::__cxx11::string::string((string *)&sStack_68,(string *)msg);
  BasicSolver::AddWarning(this_00,&local_48,&sStack_68,replace);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void AddWarning(
      std::string key, std::string msg, bool replace=false) {
    GetEnv().AddWarning(
          std::move(key), std::move(msg), replace);
  }